

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcrustes.cpp
# Opt level: O0

void testWithTranslateRotateAndScale<double>(M44d *m)

{
  ulong uVar1;
  ostream *poVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  Vec3<double> *pVVar7;
  double dVar8;
  double b;
  double c;
  size_t i_2;
  size_t i_1;
  M44d res;
  size_t i;
  vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> to;
  size_t numPoints;
  float eps;
  vector<double,_std::allocator<double>_> weights;
  vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> from;
  Rand48 rand;
  value_type *in_stack_fffffffffffffd28;
  Vec3<double> *in_stack_fffffffffffffd30;
  Vec3<double> *in_stack_fffffffffffffd38;
  vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>
  *in_stack_fffffffffffffd40;
  Vec3<double> *local_1f8;
  Matrix44<double> *in_stack_fffffffffffffe10;
  Vec3<double> *in_stack_fffffffffffffe18;
  Matrix44<double> *in_stack_fffffffffffffe68;
  ostream *in_stack_fffffffffffffe70;
  ulong local_140;
  Matrix44<double> local_138;
  ulong local_a0;
  vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> local_98;
  double local_80;
  Vec3<double> local_78;
  ulong local_60;
  undefined4 local_44;
  vector<double,_std::allocator<double>_> local_40;
  vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> local_28;
  
  std::operator<<((ostream *)&std::cout,"Testing with known translate/rotate/scale matrix\n");
  Imath_2_5::operator<<(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  Imath_2_5::Rand48::Rand48
            ((Rand48 *)in_stack_fffffffffffffd30,(unsigned_long)in_stack_fffffffffffffd28);
  std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::vector
            ((vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> *)0x17bc89)
  ;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x17bc96);
  local_44 = 0x38d1b717;
  poVar2 = std::operator<<((ostream *)&std::cout,"numPoints: ");
  std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
  local_60 = 1;
  do {
    if (9 < local_60) {
      std::operator<<((ostream *)&std::cout,"  OK\n");
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd40);
      std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::~vector
                (in_stack_fffffffffffffd40);
      return;
    }
    dVar8 = Imath_2_5::Rand48::nextf((Rand48 *)0x17bcfd);
    b = Imath_2_5::Rand48::nextf((Rand48 *)0x17bd15);
    c = Imath_2_5::Rand48::nextf((Rand48 *)0x17bd2d);
    Imath_2_5::Vec3<double>::Vec3(&local_78,dVar8,b,c);
    std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::push_back
              ((vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> *)
               in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    local_80 = Imath_2_5::Rand48::nextf((Rand48 *)0x17bd86);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd30,
               &in_stack_fffffffffffffd28->x);
    sVar3 = std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::size
                      (&local_28);
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,sVar3);
    std::operator<<(poVar2," ");
    std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::vector
              ((vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> *)
               0x17bdfd);
    local_a0 = 0;
    while( true ) {
      uVar1 = local_a0;
      sVar3 = std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::size
                        (&local_28);
      if (sVar3 <= uVar1) break;
      std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::operator[]
                (&local_28,local_a0);
      Imath_2_5::operator*(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::push_back
                ((vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> *)
                 in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
      local_a0 = local_a0 + 1;
    }
    pvVar4 = std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::
             operator[](&local_28,0);
    pvVar5 = std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::
             operator[](&local_98,0);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_40,0);
    sVar3 = std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::size
                      (&local_28);
    Imath_2_5::procrustesRotationAndTranslation<double>
              ((Vec3 *)&local_138,(Vec3 *)pvVar4,&pvVar5->x,(ulong)pvVar6,SUB81(sVar3,0));
    local_140 = 0;
    while( true ) {
      sVar3 = std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::size
                        (&local_28);
      if (sVar3 <= local_140) break;
      std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::operator[]
                (&local_28,local_140);
      Imath_2_5::operator*(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::operator[]
                (&local_98,local_140);
      Imath_2_5::Vec3<double>::operator-(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
      dVar8 = Imath_2_5::Vec3<double>::length(in_stack_fffffffffffffd38);
      if (9.999999747378752e-05 <= dVar8) {
        __assert_fail("(from[i] * res - to[i]).length() < eps",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testProcrustes.cpp"
                      ,0x75,
                      "void testWithTranslateRotateAndScale(const Imath_2_5::M44d &) [T = double]");
      }
      local_140 = local_140 + 1;
    }
    in_stack_fffffffffffffd40 =
         (vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> *)0x0;
    pvVar4 = std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::
             operator[](&local_28,0);
    pvVar5 = std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::
             operator[](&local_98,(size_type)in_stack_fffffffffffffd40);
    sVar3 = std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::size
                      (&local_28);
    Imath_2_5::procrustesRotationAndTranslation<double>
              ((Vec3 *)&stack0xfffffffffffffe10,(Vec3 *)pvVar4,(ulong)pvVar5,SUB81(sVar3,0));
    Imath_2_5::Matrix44<double>::operator=(&local_138,(Matrix44<double> *)&stack0xfffffffffffffe10);
    local_1f8 = (Vec3<double> *)0x0;
    while( true ) {
      in_stack_fffffffffffffd38 = local_1f8;
      pVVar7 = (Vec3<double> *)
               std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::size
                         (&local_28);
      if (pVVar7 <= in_stack_fffffffffffffd38) break;
      std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::operator[]
                (&local_28,(size_type)local_1f8);
      Imath_2_5::operator*(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::operator[]
                (&local_98,(size_type)local_1f8);
      Imath_2_5::Vec3<double>::operator-(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
      in_stack_fffffffffffffd30 =
           (Vec3<double> *)Imath_2_5::Vec3<double>::length(in_stack_fffffffffffffd38);
      if (9.999999747378752e-05 <= (double)in_stack_fffffffffffffd30) {
        __assert_fail("(from[i] * res - to[i]).length() < eps",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testProcrustes.cpp"
                      ,0x7a,
                      "void testWithTranslateRotateAndScale(const Imath_2_5::M44d &) [T = double]");
      }
      local_1f8 = (Vec3<double> *)((long)&local_1f8->x + 1);
    }
    std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::~vector
              (in_stack_fffffffffffffd40);
    local_60 = local_60 + 1;
  } while( true );
}

Assistant:

void testWithTranslateRotateAndScale (const IMATH_INTERNAL_NAMESPACE::M44d& m)
{
    std::cout << "Testing with known translate/rotate/scale matrix\n" << m;
    IMATH_INTERNAL_NAMESPACE::Rand48 rand(5376);

    typedef IMATH_INTERNAL_NAMESPACE::Vec3<T> V3;
    std::vector<V3> from;
    std::vector<T> weights;

    const float eps = 1e-4;
    std::cout << "numPoints: " << std::flush;
    for (size_t numPoints = 1; numPoints < 10; ++numPoints)
    {
        from.push_back (V3(rand.nextf(), rand.nextf(), rand.nextf()));
        weights.push_back (rand.nextf());
        std::cout << from.size() << " ";

        std::vector<V3> to;
        for (size_t i = 0; i < from.size(); ++i)
            to.push_back (from[i] * m);

        // weighted:
        IMATH_INTERNAL_NAMESPACE::M44d res = IMATH_INTERNAL_NAMESPACE::procrustesRotationAndTranslation (&from[0], &to[0], &weights[0], from.size(), true);
        for (size_t i = 0; i < from.size(); ++i)
            assert ((from[i] * res - to[i]).length() < eps);

        // unweighted:
        res = IMATH_INTERNAL_NAMESPACE::procrustesRotationAndTranslation (&from[0], &to[0], from.size(), true);
        for (size_t i = 0; i < from.size(); ++i)
            assert ((from[i] * res - to[i]).length() < eps);
    }
    std::cout << "  OK\n";
}